

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O3

int lyb_parse_value(lys_type *type,lyd_node_leaf_list *leaf,lyd_attr *attr,char *data,
                   unres_data *unres,lyb_state *lybs)

{
  lys_tpdf **pplVar1;
  LY_DATA_TYPE LVar2;
  lys_node_leaf *plVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  lys_module *plVar8;
  lys_type *plVar9;
  lyd_val lVar10;
  lyb_state *plVar11;
  size_t sVar12;
  lys_ident *plVar13;
  byte bVar14;
  lyd_val *plVar15;
  LY_DATA_TYPE *pLVar16;
  byte bVar17;
  LY_DATA_TYPE LVar18;
  UNRES_ITEM type_00;
  size_t count;
  ulong uVar19;
  char *pcVar20;
  uint8_t *puVar21;
  char *__format;
  ly_ctx *plVar22;
  lyd_val *plVar23;
  undefined8 uVar24;
  uint uVar25;
  long lVar26;
  lyd_node_leaf_list *leaf_00;
  ulong uVar27;
  lyd_val *local_a0;
  char *local_98;
  uint64_t buf;
  char *local_80;
  char *str;
  lyd_node_leaf_list *local_70;
  lyb_state *local_68;
  lyd_val *local_60;
  byte local_51;
  lys_type *plStack_50;
  uint8_t start_byte;
  lyd_val *local_48;
  byte local_39;
  ly_ctx *local_38;
  
  if ((leaf != (lyd_node_leaf_list *)0x0) != (attr == (lyd_attr *)0x0)) {
    __assert_fail("(leaf || attr) && (!leaf || !attr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                  ,0x2b5,
                  "int lyb_parse_value(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, const char *, struct unres_data *, struct lyb_state *)"
                 );
  }
  if (leaf == (lyd_node_leaf_list *)0x0) {
    local_a0 = (lyd_val *)&attr->value_str;
    local_60 = &attr->value;
    local_38 = (ly_ctx *)&attr->value_type;
    local_48 = (lyd_val *)&attr->value_flags;
  }
  else {
    local_a0 = (lyd_val *)&leaf->value_str;
    local_60 = &leaf->value;
    local_38 = (ly_ctx *)&leaf->value_type;
    local_48 = (lyd_val *)&leaf->value_flags;
  }
  local_68 = lybs;
  uVar4 = lyb_read(data,&local_51,1,lybs);
  plVar11 = local_68;
  if ((int)uVar4 < 0) {
    return -1;
  }
  *(LY_DATA_TYPE *)&(local_38->dict).hash_tab = local_51 & (LY_TYPE_INT32|LY_TYPE_UINT16);
  if ((char)local_51 < '\0') {
    if (leaf == (lyd_node_leaf_list *)0x0) {
      __assert_fail("leaf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                    ,0x2ca,
                    "int lyb_parse_value(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, const char *, struct unres_data *, struct lyb_state *)"
                   );
    }
    leaf->field_0x9 = leaf->field_0x9 | 1;
  }
  bVar17 = local_51 >> 5 & 2;
  bVar14 = local_48->uint8;
  if ((local_51 & 0x60) != 0) {
    local_48->uint8 = local_51 >> 5 & 1 | bVar17 | bVar14;
  }
  pcVar20 = data + uVar4;
  LVar2 = *(LY_DATA_TYPE *)&(local_38->dict).hash_tab;
  local_80 = (char *)0x0;
  plStack_50 = type;
  if (bVar17 != 0 || (bVar14 & 2) != 0) {
    iVar5 = lyb_read_string(pcVar20,&local_80,0,local_68);
    if (iVar5 < 0) {
      return -1;
    }
    pcVar20 = lydict_insert_zc(plVar11->ctx,local_80);
    local_a0->binary = pcVar20;
    plVar22 = local_38;
    plVar15 = local_48;
    leaf_00 = leaf;
    goto LAB_00144f24;
  }
  plVar9 = type;
  if (LVar2 == LY_TYPE_ENUM) {
    LVar18 = type->base;
    while (LVar18 == LY_TYPE_LEAFREF) {
      plVar3 = (plVar9->info).lref.target;
      plVar9 = &plVar3->type;
      LVar18 = (plVar3->type).base;
    }
    uVar6 = (plVar9->info).bits.count;
    while (uVar6 == 0) {
      pplVar1 = &plVar9->der;
      plVar9 = &(*pplVar1)->type;
      uVar6 = ((*pplVar1)->type).info.bits.count;
    }
  }
  else if (LVar2 == LY_TYPE_BITS) {
    LVar18 = type->base;
    while (LVar18 == LY_TYPE_LEAFREF) {
      plVar3 = (plVar9->info).lref.target;
      plVar9 = &plVar3->type;
      LVar18 = (plVar3->type).base;
    }
    uVar6 = (plVar9->info).bits.count;
    while (uVar6 == 0) {
      pplVar1 = &plVar9->der;
      plVar9 = &(*pplVar1)->type;
      uVar6 = ((*pplVar1)->type).info.bits.count;
    }
  }
  iVar5 = 0;
  local_70 = leaf;
  switch(LVar2) {
  case LY_TYPE_BINARY:
  case LY_TYPE_STRING:
  case LY_TYPE_UNKNOWN:
    iVar5 = lyb_read_string(pcVar20,&local_80,0,local_68);
    if (iVar5 < 0) {
      return -1;
    }
    pcVar20 = lydict_insert_zc(local_68->ctx,local_80);
    plVar15 = local_60;
    goto LAB_00144e68;
  case LY_TYPE_BITS:
    lVar10.ptr = calloc((ulong)(plVar9->info).bits.count,8);
    *local_60 = lVar10;
    if (lVar10.binary == (char *)0x0) {
      pcVar20 = "lyb_parse_val_1";
      plVar22 = local_68->ctx;
      goto LAB_00145619;
    }
    iVar5 = 0;
    plVar22 = local_38;
    plVar15 = local_48;
    leaf_00 = local_70;
    if ((plVar9->info).bits.count != 0) {
      lVar26 = 0;
      uVar27 = 0;
      plVar11 = local_68;
      do {
        if ((uVar27 & 7) == 0) {
          str._4_4_ = iVar5;
          iVar5 = lyb_read(pcVar20 + iVar5,&local_39,1,plVar11);
          if (iVar5 < 0) {
            return -1;
          }
          iVar5 = str._4_4_ + iVar5;
          lVar10.dec64._1_7_ = 0;
          lVar10.bln = local_39;
          plVar11 = local_68;
          plVar22 = local_38;
          plVar15 = local_48;
        }
        if (((lVar10.uint32 & 0xff) >> (int)(uVar27 & 7) & 1) != 0) {
          *(long *)(local_60->binary + uVar27 * 8) = (long)&((plVar9->info).bits.bit)->name + lVar26
          ;
        }
        uVar27 = uVar27 + 1;
        lVar26 = lVar26 + 0x30;
      } while (uVar27 < (plVar9->info).bits.count);
      goto LAB_00144f18;
    }
    break;
  case LY_TYPE_BOOL:
    iVar5 = lyb_read(pcVar20,&local_39,1,local_68);
    plVar22 = local_38;
    plVar15 = local_48;
    if ((iVar5 < 1) || (local_39 == 0)) goto LAB_00144f18;
    local_60->bln = '\x01';
    leaf_00 = local_70;
    break;
  case LY_TYPE_DEC64:
  case LY_TYPE_INT64:
  case LY_TYPE_UINT64:
    local_98 = (char *)0x0;
    iVar5 = lyb_read(pcVar20,(uint8_t *)&local_98,8,local_68);
    if (iVar5 < 0) {
LAB_00144f0b:
      iVar5 = -1;
      plVar22 = local_38;
      plVar15 = local_48;
    }
    else {
      local_60->binary = local_98;
      plVar22 = local_38;
      plVar15 = local_48;
    }
    goto LAB_00144f18;
  case LY_TYPE_EMPTY:
    goto switchD_00144dcb_caseD_5;
  case LY_TYPE_ENUM:
    uVar6 = (plVar9->info).bits.count;
    count = 1;
    if ((0xff < uVar6) && (count = 2, 0xffff < uVar6)) {
      count = 4 - (ulong)(uVar6 < 0x1000000);
    }
    local_98 = (char *)0x0;
    iVar7 = lyb_read(pcVar20,(uint8_t *)&local_98,count,local_68);
    if (iVar7 < 0) {
      return -1;
    }
    plVar22 = local_38;
    plVar15 = local_48;
    leaf_00 = local_70;
    iVar5 = 0;
    if (iVar7 != 0) {
      if ((char *)(ulong)(plVar9->info).bits.count <= local_98) {
        __assert_fail("num < type->info.enums.count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                      ,0x1c3,
                      "int lyb_parse_val_1(struct lys_type *, LY_DATA_TYPE, uint8_t, const char *, const char **, lyd_val *, struct lyb_state *)"
                     );
      }
      local_60->binary = (char *)((plVar9->info).bits.bit + (long)local_98);
      iVar5 = iVar7;
    }
    break;
  case LY_TYPE_IDENT:
  case LY_TYPE_INST:
  case LY_TYPE_UNION:
    iVar5 = lyb_read_string(pcVar20,&local_80,0,local_68);
    if (iVar5 < 0) {
      return -1;
    }
    pcVar20 = lydict_insert_zc(local_68->ctx,local_80);
    plVar15 = local_a0;
LAB_00144e68:
    plVar15->binary = pcVar20;
switchD_00144dcb_caseD_5:
    plVar22 = local_38;
    plVar15 = local_48;
    leaf_00 = local_70;
    break;
  default:
    return -1;
  case LY_TYPE_INT8:
  case LY_TYPE_UINT8:
    local_98 = (char *)0x0;
    iVar5 = lyb_read(pcVar20,(uint8_t *)&local_98,1,local_68);
    if (iVar5 < 0) goto LAB_00144f0b;
    local_60->bln = (int8_t)local_98;
    plVar22 = local_38;
    plVar15 = local_48;
    goto LAB_00144f18;
  case LY_TYPE_INT16:
  case LY_TYPE_UINT16:
    local_98 = (char *)0x0;
    iVar5 = lyb_read(pcVar20,(uint8_t *)&local_98,2,local_68);
    if (iVar5 < 0) goto LAB_00144f0b;
    local_60->int16 = (int16_t)local_98;
    plVar22 = local_38;
    plVar15 = local_48;
    goto LAB_00144f18;
  case LY_TYPE_INT32:
  case LY_TYPE_UINT32:
    local_98 = (char *)0x0;
    iVar5 = lyb_read(pcVar20,(uint8_t *)&local_98,4,local_68);
    if (iVar5 < 0) goto LAB_00144f0b;
    local_60->int32 = (int32_t)local_98;
    plVar22 = local_38;
    plVar15 = local_48;
LAB_00144f18:
    leaf_00 = local_70;
    if (iVar5 < 0) {
      return -1;
    }
  }
LAB_00144f24:
  plVar9 = plStack_50;
  if ((plStack_50->base == LY_TYPE_UNION) && ((plVar15->uint8 & 2) == 0)) {
    if (*(LY_DATA_TYPE *)&(plVar22->dict).hash_tab != LY_TYPE_STRING) {
      __assert_fail("*value_type == LY_TYPE_STRING",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                    ,0x2d9,
                    "int lyb_parse_value(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, const char *, struct unres_data *, struct lyb_state *)"
                   );
    }
    local_a0->binary = *(char **)local_60;
    local_60->binary = (char *)0x0;
    *(LY_DATA_TYPE *)&(plVar22->dict).hash_tab = LY_TYPE_UNION;
  }
  str._4_4_ = iVar5;
  if (leaf_00 == (lyd_node_leaf_list *)0x0) {
    plVar8 = attr->annotation->module;
    local_38 = plVar8->ctx;
    plVar8 = lys_main_module(plVar8);
    plVar15 = (lyd_val *)&attr->value_str;
    if ((attr->value_flags & 2) != 0) {
      puVar21 = &attr->value_flags;
      *puVar21 = attr->value_flags & 0xfd;
      uVar6 = 0;
      goto LAB_00145056;
    }
    plVar23 = &attr->value;
    pLVar16 = &attr->value_type;
  }
  else {
    local_38 = leaf_00->schema->module->ctx;
    plVar8 = lys_node_module(leaf_00->schema);
    plVar15 = (lyd_val *)&leaf_00->value_str;
    if ((leaf_00->value_flags & 2) != 0) {
      puVar21 = &leaf_00->value_flags;
      leaf_00->value_flags = leaf_00->value_flags & 0xfd;
      uVar6 = (byte)leaf_00->field_0x9 & 1;
LAB_00145056:
      plVar9 = lyp_parse_value(plVar9,&plVar15->binary,(lyxml_elem *)0x0,leaf_00,attr,
                               (lys_module *)0x0,1,uVar6,1);
      if (plVar9 == (lys_type *)0x0) {
        return -1;
      }
      if ((*puVar21 & 2) == 0) {
        ly_log(local_38,LY_LLWRN,LY_SUCCESS,
               "Value \"%s\" was stored as a user type, but it is not in the current context.",
               plVar15);
      }
      goto LAB_001455fc;
    }
    plVar23 = &leaf_00->value;
    pLVar16 = &leaf_00->value_type;
  }
  LVar2 = *pLVar16;
  LVar18 = plStack_50->base;
  plVar9 = plStack_50;
  if ((LVar18 - LY_TYPE_INST < 2) ||
     ((LVar18 == LY_TYPE_UNION && ((plStack_50->info).uni.has_ptr_type != 0)))) {
    plVar9 = (lys_type *)0x0;
    switch(LVar2) {
    case LY_TYPE_BITS:
      plVar9 = plStack_50;
      while (LVar18 == LY_TYPE_LEAFREF) {
        plVar3 = (plVar9->info).lref.target;
        plVar9 = &plVar3->type;
        LVar18 = (plVar3->type).base;
      }
      goto LAB_001450d0;
    default:
      goto switchD_0014500a_caseD_3;
    case LY_TYPE_DEC64:
      plVar9 = plStack_50;
      if (LVar18 == LY_TYPE_LEAFREF) {
        plVar3 = (plStack_50->info).lref.target;
        if ((plVar3->type).base == LY_TYPE_LEAFREF) {
          do {
          } while( true );
        }
        plVar9 = &plVar3->type;
      }
      goto switchD_001450fe_caseD_4;
    case LY_TYPE_IDENT:
    case LY_TYPE_INST:
    case LY_TYPE_UNION:
      goto switchD_0014500a_caseD_7;
    }
  }
  if (LVar2 != LY_TYPE_BITS) {
    if (LVar2 != LY_TYPE_DEC64) {
      plVar9 = (lys_type *)0x0;
      goto switchD_0014500a_caseD_3;
    }
switchD_001450fe_caseD_4:
    uVar27 = (plVar9->info).dec64.div;
    bVar14 = (plVar9->info).dec64.dig;
    for (uVar19 = (ulong)plVar23->dec64 % uVar27;
        (1 < bVar14 && (uVar19 == ((long)uVar19 / 10) * 10)); uVar19 = (long)uVar19 / 10) {
      bVar14 = bVar14 - 1;
    }
    sprintf((char *)&local_98,"%ld.%.*ld",plVar23->dec64 / (long)uVar27,(ulong)bVar14);
    goto LAB_0014555a;
  }
LAB_001450d0:
  uVar6 = (plVar9->info).bits.count;
  while (uVar6 == 0) {
    pplVar1 = &plVar9->der;
    plVar9 = &(*pplVar1)->type;
    uVar6 = ((*pplVar1)->type).info.bits.count;
  }
switchD_0014500a_caseD_3:
  switch(LVar2) {
  case LY_TYPE_BINARY:
  case LY_TYPE_STRING:
  case LY_TYPE_UNKNOWN:
    lVar10.ident = *(lys_ident **)plVar23;
    goto LAB_00145103;
  case LY_TYPE_BITS:
    local_60 = plVar15;
    local_48 = plVar23;
    plVar11 = (lyb_state *)malloc(1);
    if (plVar11 == (lyb_state *)0x0) {
LAB_00145607:
      pcVar20 = "lyb_parse_val_2";
      plVar22 = local_38;
LAB_00145619:
      ly_log(plVar22,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar20);
      return -1;
    }
    *(undefined1 *)&plVar11->written = 0;
    uVar6 = (plVar9->info).bits.count;
    local_68 = plVar11;
    if (uVar6 != 0) {
      uVar27 = 0;
      uVar25 = 0;
      plVar15 = local_48;
      do {
        if (*(undefined8 **)(plVar15->binary + uVar27 * 8) != (undefined8 *)0x0) {
          sVar12 = strlen((char *)**(undefined8 **)(plVar15->binary + uVar27 * 8));
          plVar11 = (lyb_state *)
                    ly_realloc(local_68,((ulong)uVar25 - (ulong)(uVar25 == 0)) + sVar12 + 2);
          if (plVar11 == (lyb_state *)0x0) goto LAB_00145607;
          pcVar20 = "";
          if (uVar25 != 0) {
            pcVar20 = " ";
          }
          local_68 = plVar11;
          iVar5 = sprintf((char *)((long)&plVar11->written + (ulong)uVar25),"%s%s",pcVar20,
                          **(undefined8 **)(local_48->binary + uVar27 * 8));
          uVar25 = uVar25 + iVar5;
          uVar6 = (plVar9->info).bits.count;
          plVar15 = local_48;
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 < uVar6);
    }
    lVar10.binary = lydict_insert_zc(local_38,(char *)local_68);
    plVar15 = local_60;
LAB_00145103:
    plVar15->ident = (lys_ident *)lVar10;
    break;
  case LY_TYPE_BOOL:
    pcVar20 = "true";
    if (plVar23->bln == 0) {
      pcVar20 = "false";
    }
    goto LAB_001454c8;
  case LY_TYPE_DEC64:
    goto switchD_001450fe_caseD_4;
  case LY_TYPE_EMPTY:
    pcVar20 = "";
    goto LAB_001454c8;
  case LY_TYPE_ENUM:
    pcVar20 = plVar23->enm->name;
LAB_001454c8:
    pcVar20 = lydict_insert(local_38,pcVar20,0);
    plVar15->binary = pcVar20;
    break;
  case LY_TYPE_IDENT:
    if (leaf_00 == (lyd_node_leaf_list *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (byte)leaf_00->field_0x9 & 1;
    }
    plVar13 = resolve_identref(plStack_50,plVar15->binary,(lyd_node *)leaf_00,plVar8,uVar6);
    plVar23->ident = plVar13;
    if (plVar13 == (lys_ident *)0x0) {
      return -1;
    }
    break;
  case LY_TYPE_INST:
    plVar23->binary = (char *)0x0;
    break;
  default:
    goto LAB_0014562c;
  case LY_TYPE_UNION:
    if (attr == (lyd_attr *)0x0) {
      iVar5 = resolve_union(leaf_00,plStack_50,1,2,(lys_type **)0x0);
      if (iVar5 != 0) {
        return -1;
      }
      break;
    }
    uVar24 = 0x250;
    goto LAB_001455ca;
  case LY_TYPE_INT8:
    uVar27 = (ulong)(uint)(int)plVar23->bln;
    goto LAB_001454ea;
  case LY_TYPE_UINT8:
    uVar27 = (ulong)plVar23->uint8;
    goto LAB_0014553f;
  case LY_TYPE_INT16:
    uVar27 = (ulong)(uint)(int)plVar23->int16;
    goto LAB_001454ea;
  case LY_TYPE_UINT16:
    uVar27 = (ulong)plVar23->uint16;
    goto LAB_0014553f;
  case LY_TYPE_INT32:
    uVar27 = (ulong)plVar23->uint32;
LAB_001454ea:
    pcVar20 = "%d";
LAB_00145546:
    sprintf((char *)&local_98,pcVar20,uVar27);
LAB_0014555a:
    pcVar20 = lydict_insert(local_38,(char *)&local_98,0);
    plVar15->binary = pcVar20;
    break;
  case LY_TYPE_UINT32:
    uVar27 = (ulong)plVar23->uint32;
LAB_0014553f:
    pcVar20 = "%u";
    goto LAB_00145546;
  case LY_TYPE_INT64:
    pcVar20 = plVar23->binary;
    __format = "%ld";
    goto LAB_00145526;
  case LY_TYPE_UINT64:
    pcVar20 = plVar23->binary;
    __format = "%lu";
LAB_00145526:
    sprintf((char *)&local_98,__format,pcVar20);
    goto LAB_0014555a;
  }
  LVar18 = plStack_50->base;
  if ((1 < LVar18 - LY_TYPE_INST) &&
     ((LVar18 != LY_TYPE_UNION || (LVar18 = LY_TYPE_UNION, (plStack_50->info).uni.has_ptr_type == 0)
      ))) {
LAB_001455fc:
    return str._4_4_ + uVar4;
  }
switchD_0014500a_caseD_7:
  if (plVar15->binary == (char *)0x0) {
    __assert_fail("*value_str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                  ,0x28f,
                  "int lyb_parse_val_2(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, struct unres_data *)"
                 );
  }
  if (attr == (lyd_attr *)0x0) {
    if (LVar18 == LY_TYPE_LEAFREF) {
      type_00 = UNRES_LEAFREF;
    }
    else if (LVar18 == LY_TYPE_INST) {
      type_00 = UNRES_INSTID;
    }
    else {
      type_00 = UNRES_UNION;
    }
    iVar5 = unres_data_add(unres,(lyd_node *)leaf_00,type_00);
    if (iVar5 == 0) goto LAB_001455fc;
  }
  else {
    uVar24 = 0x293;
LAB_001455ca:
    ly_log(local_38,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
           ,uVar24);
  }
LAB_0014562c:
  return -1;
}

Assistant:

static int
lyb_parse_value(struct lys_type *type, struct lyd_node_leaf_list *leaf, struct lyd_attr *attr, const char *data,
                struct unres_data *unres, struct lyb_state *lybs)
{
    int r, ret = 0;
    uint8_t start_byte;

    const char **value_str;
    lyd_val *value;
    LY_DATA_TYPE *value_type;
    uint8_t *value_flags;

    assert((leaf || attr) && (!leaf || !attr));

    if (leaf) {
        value_str = &leaf->value_str;
        value = &leaf->value;
        value_type = &leaf->value_type;
        value_flags = &leaf->value_flags;
    } else {
        value_str = &attr->value_str;
        value = &attr->value;
        value_type = &attr->value_type;
        value_flags = &attr->value_flags;
    }

    /* read value type and flags on the first byte */
    ret += (r = lyb_read(data, &start_byte, sizeof start_byte, lybs));
    LYB_HAVE_READ_RETURN(r, data, -1);

    /* fill value type, flags */
    *value_type = start_byte & 0x1F;
    if (start_byte & 0x80) {
        assert(leaf);
        leaf->dflt = 1;
    }
    if (start_byte & 0x40) {
        *value_flags |= LY_VALUE_USER;
    }
    if (start_byte & 0x20) {
        *value_flags |= LY_VALUE_UNRES;
    }

    ret += (r = lyb_parse_val_1(type, *value_type, *value_flags, data, value_str, value, lybs));
    LYB_HAVE_READ_RETURN(r, data, -1);

    /* union is handled specially */
    if ((type->base == LY_TYPE_UNION) && !(*value_flags & LY_VALUE_USER)) {
        assert(*value_type == LY_TYPE_STRING);

        *value_str = value->string;
        value->string = NULL;
        *value_type = LY_TYPE_UNION;
    }

    ret += (r = lyb_parse_val_2(type, leaf, attr, unres));
    LYB_HAVE_READ_RETURN(r, data, -1);

    return ret;
}